

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

uint GetArgumentOffset(FunctionData *data,uint argument)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  
  if (argument == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if ((data->arguments).count <= argument - 1) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                     );
      }
      iVar1 = *(int *)(*(long *)((long)&((data->arguments).data)->type + lVar3) + 0x30);
      iVar4 = 4;
      if (2 < iVar1 - 1U) {
        iVar4 = iVar1;
      }
      uVar2 = uVar2 + iVar4;
      lVar3 = lVar3 + 0x30;
    } while ((ulong)argument * 0x30 != lVar3);
  }
  return uVar2;
}

Assistant:

unsigned GetArgumentOffset(FunctionData *data, unsigned argument)
{
	// Start at context
	unsigned offset = 0;

	for(unsigned i = 0; i < argument; i++)
	{
		unsigned size = unsigned(data->arguments[i].type->size);

		if(size != 0 && size < 4)
			size = 4;

		offset += size;
	}

	return offset;
}